

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O3

void __thiscall ValueInfo::Dump(ValueInfo *this)

{
  long lVar1;
  EquivalentTypeSet *this_00;
  bool bVar2;
  JITType *this_01;
  intptr_t iVar3;
  JITTypeHolder JVar4;
  int iVar5;
  int iVar6;
  IntConstantBounds local_148;
  IntConstantBounds intConstantBounds;
  nullptr_t local_40;
  JITTypeHolderBase<void> local_38;
  JITTypeHolder type;
  
  bVar2 = IsJsType(this);
  if (!bVar2) {
    ValueType::ToString(&this->super_ValueType,(char (*) [256])&local_148);
    Output::Print(L"%S",&local_148);
  }
  local_148.lowerBound = 0;
  local_148.upperBound = 0;
  bVar2 = TryGetIntConstantBounds(this,&local_148,false);
  if (bVar2) {
    if (local_148.lowerBound == local_148.upperBound) {
      Output::Print(L" constant:%d");
      return;
    }
    Output::Print(L" range:%d - %d");
  }
  else {
    bVar2 = ValueType::IsFloat(&this->super_ValueType);
    if ((bVar2) && (this->structureKind == FloatConstant)) {
      AsFloatConstant(this);
      Output::Print(L" constant:%g",this[1]._vptr_ValueInfo);
    }
    else {
      bVar2 = IsJsType(this);
      if (bVar2) {
        AsJsType(this);
        local_38.t = (Type)this[1]._vptr_ValueInfo;
        local_40 = (nullptr_t)0x0;
        bVar2 = JITTypeHolderBase<void>::operator!=(&local_38,&local_40);
        if (bVar2) {
          this_01 = JITTypeHolderBase<void>::operator->(&local_38);
          iVar3 = JITType::GetAddr(this_01);
          Output::Print(L"type: 0x%p, ",iVar3);
        }
        else {
          Output::Print(L"type: null, ");
        }
        Output::Print(L"type Set: ");
        AsJsType(this);
        this_00 = *(EquivalentTypeSet **)&this[1].super_ValueType;
        if (this_00 == (EquivalentTypeSet *)0x0) {
          Output::Print(L"null");
        }
        else {
          iVar5 = this_00->count - 1;
          if (1 < this_00->count) {
            iVar6 = 0;
            do {
              JVar4 = Js::EquivalentTypeSet::GetType(this_00,(uint16)iVar6);
              Output::Print(L"0x%p, ",JVar4.t);
              iVar6 = iVar6 + 1;
            } while (iVar5 != iVar6);
          }
          JVar4 = Js::EquivalentTypeSet::GetType(this_00,(uint16)iVar5);
          Output::Print(L"0x%p",JVar4.t);
        }
      }
      else {
        bVar2 = ValueType::IsAnyOptimizedArray(&this->super_ValueType);
        if ((bVar2) && (this->structureKind == Array)) {
          AsArrayValueInfo(this);
          if (this[1]._vptr_ValueInfo != (_func_int **)0x0) {
            Output::Print(L" seg: ");
            Sym::Dump((Sym *)this[1]._vptr_ValueInfo,(ValueType)0x9);
          }
          lVar1._0_2_ = this[1].super_ValueType;
          lVar1._2_2_ = *(undefined2 *)&this[1].field_0xa;
          lVar1._4_4_ = this[1].structureKind;
          if (lVar1 != 0) {
            Output::Print(L" segLen: ");
            Sym::Dump(*(Sym **)&this[1].super_ValueType,(ValueType)0x9);
          }
          if (this[1].symStore != (Sym *)0x0) {
            Output::Print(L" len: ");
            Sym::Dump(this[1].symStore,(ValueType)0x9);
          }
        }
      }
    }
  }
  if (this->symStore != (Sym *)0x0) {
    Output::Print(L"\t\tsym:");
    Sym::Dump(this->symStore,(ValueType)0x9);
  }
  return;
}

Assistant:

void ValueInfo::Dump()
{
    if (!IsJsType()) // The value type is uninitialized for a type value
    {
        char typeStr[VALUE_TYPE_MAX_STRING_SIZE];
        Type().ToString(typeStr);
        Output::Print(_u("%S"), typeStr);
    }

    IntConstantBounds intConstantBounds;
    if (TryGetIntConstantBounds(&intConstantBounds))
    {
        if (intConstantBounds.IsConstant())
        {
            Output::Print(_u(" constant:%d"), intConstantBounds.LowerBound());
            return;
        }
        Output::Print(_u(" range:%d - %d"), intConstantBounds.LowerBound(), intConstantBounds.UpperBound());
    }
    else if (IsFloatConstant())
    {
        Output::Print(_u(" constant:%g"), AsFloatConstant()->FloatValue());
    }
    else if (IsJsType())
    {
        const JITTypeHolder type(AsJsType()->GetJsType());
        type != nullptr ? Output::Print(_u("type: 0x%p, "), type->GetAddr()) : Output::Print(_u("type: null, "));
        Output::Print(_u("type Set: "));
        Js::EquivalentTypeSet* typeSet = AsJsType()->GetJsTypeSet();
        if (typeSet != nullptr)
        {
            uint16 typeCount = typeSet->GetCount();
            for (uint16 ti = 0; ti < typeCount - 1; ti++)
            {
                Output::Print(_u("0x%p, "), typeSet->GetType(ti));
            }
            Output::Print(_u("0x%p"), typeSet->GetType(typeCount - 1));
        }
        else
        {
            Output::Print(_u("null"));
        }
    }
    else if (IsArrayValueInfo())
    {
        const ArrayValueInfo *const arrayValueInfo = AsArrayValueInfo();
        if (arrayValueInfo->HeadSegmentSym())
        {
            Output::Print(_u(" seg: "));
            arrayValueInfo->HeadSegmentSym()->Dump();
        }
        if (arrayValueInfo->HeadSegmentLengthSym())
        {
            Output::Print(_u(" segLen: "));
            arrayValueInfo->HeadSegmentLengthSym()->Dump();
        }
        if (arrayValueInfo->LengthSym())
        {
            Output::Print(_u(" len: "));
            arrayValueInfo->LengthSym()->Dump();
        }
    }

    if (this->GetSymStore())
    {
        Output::Print(_u("\t\tsym:"));
        this->GetSymStore()->Dump();
    }
}